

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::calcViscosity(PeleLM *this,Real time,Real param_3,int param_4,int param_5)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> *this_00;
  long in_RDI;
  Array4<double> *mu;
  Array4<const_double> *T;
  Array4<const_double> *rhoY;
  Box *gbx;
  MFIter mfi;
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *ltransparm;
  MultiFab *S;
  MultiFab *visc;
  TimeLevel whichTime;
  int in_stack_fffffffffffffd6c;
  AmrLevel *in_stack_fffffffffffffd70;
  FabArray<amrex::FArrayBox> *this_01;
  undefined8 local_278;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffffd98;
  MFIter *in_stack_fffffffffffffda0;
  anon_class_200_4_c1b0e55e *in_stack_fffffffffffffdb8;
  Box *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  AmrLevel *in_stack_fffffffffffffde8;
  undefined1 auStack_1e8 [64];
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *local_1a8;
  undefined1 local_1a0 [64];
  undefined1 *local_160;
  undefined1 local_158 [64];
  undefined1 *local_118;
  undefined1 local_110 [64];
  undefined1 *local_d0;
  undefined1 local_c4 [132];
  TransParm<pele::physics::eos::Fuego,_pele::physics::transport::SimpleTransport> *local_40;
  FabArray<amrex::FArrayBox> *local_38;
  undefined8 local_30;
  TimeLevel local_24;
  
  local_24 = amrex::AmrLevel::which_time
                       (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                        (Real)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  if (local_24 == AmrOldTime) {
    local_278 = *(undefined8 *)(in_RDI + 0xc10);
  }
  else {
    local_278 = *(undefined8 *)(in_RDI + 0xc18);
  }
  local_30 = local_278;
  if (local_24 == AmrOldTime) {
    this_00 = &amrex::AmrLevel::get_old_data(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)->
               super_FabArray<amrex::FArrayBox>;
    do_tiling_ = (undefined1)((ulong)in_RDI >> 0x38);
  }
  else {
    this_00 = &amrex::AmrLevel::get_new_data(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c)->
               super_FabArray<amrex::FArrayBox>;
    do_tiling_ = (undefined1)((ulong)in_RDI >> 0x38);
  }
  local_38 = this_00;
  local_40 = pele::physics::transport::TransportParams<pele::physics::transport::SimpleTransport>::
             device_trans_parm(&trans_parms);
  this_01 = local_38;
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,(bool)do_tiling_);
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_c4 + 0x24));
    if (!bVar1) break;
    amrex::MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffddc);
    local_c4._28_8_ = local_c4;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)this_01,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    local_d0 = local_110;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this_00,(MFIter *)this_01,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    local_118 = local_158;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (this_01,(MFIter *)in_stack_fffffffffffffd70);
    local_160 = local_1a0;
    in_stack_fffffffffffffd70 = (AmrLevel *)local_c4._28_8_;
    memcpy(&stack0xfffffffffffffd98,local_d0,0x3c);
    memcpy(&stack0xfffffffffffffdd8,local_118,0x3c);
    memcpy(auStack_1e8,local_160,0x3c);
    local_1a8 = local_40;
    amrex::ParallelFor<PeleLM::calcViscosity(double,double,int,int)::__0>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    amrex::MFIter::operator++((MFIter *)(local_c4 + 0x24));
  }
  amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

void
PeleLM::calcViscosity (const Real time,
                       const Real /*dt*/,
                       const int  /*iteration*/,
                       const int  /*ncycle*/)
{
   BL_PROFILE("PLM::calcViscosity()");

   const TimeLevel whichTime = which_time(State_Type, time);
   AMREX_ASSERT(whichTime == AmrOldTime || whichTime == AmrNewTime);

   MultiFab& visc = (whichTime == AmrOldTime ? *viscn_cc : *viscnp1_cc);
   // --> We assume the class state data has been properly FillPatched already !
   const MultiFab& S = (whichTime == AmrOldTime) ? get_old_data(State_Type) : get_new_data(State_Type);

   // Get the transport GPU data pointer
   auto const* ltransparm = trans_parms.device_trans_parm();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S, TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& gbx = mfi.growntilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& mu      = visc.array(mfi);
      amrex::ParallelFor(gbx, [rhoY, T, mu, ltransparm]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         getVelViscosity( i, j, k, rhoY, T, mu, ltransparm);
      });
   }
}